

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# for_each.hpp
# Opt level: O0

anon_class_48_5_086014e6 * __thiscall
tf::
make_for_each_index_task<unsigned_long,unsigned_long,unsigned_long,mixed_algorithms_with_silent_dependent_async(unsigned_int)::__1,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
          (anon_class_48_5_086014e6 *__return_storage_ptr__,tf *this,unsigned_long b,unsigned_long e
          ,unsigned_long s,anon_class_8_1_898a9ca8 c,
          GuidedPartitioner<tf::DefaultClosureWrapper> part)

{
  unsigned_long s_local;
  unsigned_long e_local;
  unsigned_long b_local;
  GuidedPartitioner<tf::DefaultClosureWrapper> part_local;
  anon_class_8_1_898a9ca8 c_local;
  
  __return_storage_ptr__->b = (unsigned_long)this;
  __return_storage_ptr__->e = b;
  __return_storage_ptr__->s = e;
  (__return_storage_ptr__->part).super_PartitionerBase<tf::DefaultClosureWrapper>._chunk_size =
       (size_t)c.data;
  (__return_storage_ptr__->part).super_PartitionerBase<tf::DefaultClosureWrapper>.field_0x8 =
       part_local.super_PartitionerBase<tf::DefaultClosureWrapper>._8_1_;
  (__return_storage_ptr__->c).data = (vector<int,_std::allocator<int>_> *)s;
  return __return_storage_ptr__;
}

Assistant:

auto make_for_each_index_task(B b, E e, S s, C c, P part = P()){
  
  using B_t = std::decay_t<unwrap_ref_decay_t<B>>;
  using E_t = std::decay_t<unwrap_ref_decay_t<E>>;
  using S_t = std::decay_t<unwrap_ref_decay_t<S>>;

  return [=] (Runtime& rt) mutable {

    // fetch the iterator values
    B_t beg = b;
    E_t end = e;
    S_t inc = s;
    
    // nothing to be done if the range is invalid
    if(is_index_range_invalid(beg, end, inc)) {
      return;
    }

    size_t W = rt.executor().num_workers();
    size_t N = distance(beg, end, inc);

    // only myself - no need to spawn another graph
    if(W <= 1 || N <= part.chunk_size()) {
      part([=]() mutable {
        for(size_t x=0; x<N; x++, beg+=inc) {
          c(beg);
        }
      })();
      return;
    }

    PreemptionGuard preemption_guard(rt);
    
    if(N < W) {
      W = N;
    }
    
    // static partitioner
    if constexpr(part.type() == PartitionerType::STATIC) {
      for(size_t w=0, curr_b=0; w<W && curr_b < N;) {
        auto chunk_size = part.adjusted_chunk_size(N, W, w);
        auto task = part([=] () mutable {
          part.loop(N, W, curr_b, chunk_size, [=] (size_t part_b, size_t part_e) {
            auto idx = static_cast<B_t>(part_b) * inc + beg;
            for(size_t x=part_b; x<part_e; x++, idx += inc) {
              c(idx);
            }
          });
        });
        (++w == W || (curr_b += chunk_size) >= N) ? task() : rt.silent_async(task);
      }
    }
    // dynamic partitioner
    else {
      auto next = std::make_shared<std::atomic<size_t>>(0);
      for(size_t w=0; w<W;) {
        auto task = part([=] () mutable {
          part.loop(N, W, *next, [=] (size_t part_b, size_t part_e) mutable {
            auto idx = static_cast<B_t>(part_b) * inc + beg;
            for(size_t x=part_b; x<part_e; x++, idx += inc) {
              c(idx);
            }
          });
        });
        (++w == W) ? task() : rt.silent_async(task);
      }
    }
  };
}